

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_insert_setinvalid(lyd_node *node)

{
  uint8_t *puVar1;
  LYS_NODE LVar2;
  lys_node *plVar3;
  int iVar4;
  lyd_node *plVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcc0,"void lyd_insert_setinvalid(struct lyd_node *)");
  }
  iVar4 = ly_new_node_validity(node->schema);
  node->validity = (uint8_t)iVar4;
  for (plVar5 = node->parent; plVar5 != (lyd_node *)0x0; plVar5 = plVar5->parent) {
    if (plVar5->schema->nodetype == LYS_LIST) {
      plVar6 = node;
      if ((plVar5->validity & 1) == 0) goto LAB_001617ad;
      break;
    }
  }
  goto LAB_0016181c;
LAB_001617ad:
  do {
    LVar2 = plVar6->schema->nodetype;
    if (LVar2 == LYS_LIST) {
LAB_001617d0:
      plVar7 = plVar6->next;
      if (plVar7 == (lyd_node *)0x0) {
        if (plVar6 == node) break;
        plVar7 = (lyd_node *)0x0;
      }
    }
    else {
      if ((LVar2 == LYS_LEAF) && ((plVar6->schema->flags & 0x100) != 0)) {
        plVar5->validity = plVar5->validity | 1;
        break;
      }
      if ((LVar2 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        if (plVar6 != node) goto LAB_001617d0;
        break;
      }
      plVar7 = plVar6->child;
      if (plVar7 == (lyd_node *)0x0) goto LAB_001617d0;
    }
    if (plVar7 == (lyd_node *)0x0) {
      do {
        plVar6 = plVar6->parent;
        if (plVar6->parent == node->parent) break;
        plVar7 = plVar6->parent->next;
      } while (plVar7 == (lyd_node *)0x0);
    }
    plVar6 = plVar7;
  } while (plVar7 != (lyd_node *)0x0);
LAB_0016181c:
  if (node->parent != (lyd_node *)0x0) {
    plVar3 = node->schema;
    if ((plVar3->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
      if ((plVar3->nodetype & LYS_LIST) == LYS_UNKNOWN) {
        return;
      }
      iVar4 = *(int *)((long)&plVar3[1].iffeature + 4);
    }
    else {
      iVar4 = *(int *)((long)&plVar3[1].priv + 4);
    }
    if (iVar4 != 0) {
      puVar1 = &node->parent->validity;
      *puVar1 = *puVar1 | 2;
    }
  }
  return;
}

Assistant:

static void
lyd_insert_setinvalid(struct lyd_node *node)
{
    struct lyd_node *next, *elem, *parent_list;

    assert(node);

    /* overall validity of the node itself */
    node->validity = ly_new_node_validity(node->schema);

    /* explore changed unique leaves */
    /* first, get know if there is a list in parents chain */
    for (parent_list = node->parent;
         parent_list && parent_list->schema->nodetype != LYS_LIST;
         parent_list = parent_list->parent);
    if (parent_list && !(parent_list->validity & LYD_VAL_UNIQUE)) {
        /* there is a list, so check if we inserted a leaf supposed to be unique */
        for (elem = node; elem; elem = next) {
            if (elem->schema->nodetype == LYS_LIST) {
                /* stop searching to the depth, children would be unique to a list in subtree */
                goto nextsibling;
            }

            if (elem->schema->nodetype == LYS_LEAF && (elem->schema->flags & LYS_UNIQUE)) {
                /* set flag to list for future validation */
                parent_list->validity |= LYD_VAL_UNIQUE;
                break;
            }

            if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                if (elem == node) {
                    /* stop the loop */
                    break;
                }
                goto nextsibling;
            }

            /* select next elem to process */
            /* go into children */
            next = elem->child;
            /* go through siblings */
            if (!next) {
nextsibling:
                next = elem->next;
                if (!next) {
                    /* no sibling */
                    if (elem == node) {
                        /* we are done, back in start node */
                        break;
                    }
                }
            }
            /* go back to parents */
            while (!next) {
                elem = elem->parent;
                if (elem->parent == node->parent) {
                    /* we are done, back in start node */
                    break;
                }
                /* parent was actually already processed, so go to the parent's sibling */
                next = elem->parent->next;
            }
        }
    }

    if (node->parent) {
        /* if the inserted node is list/leaflist with constraint on max instances,
         * invalidate the parent to make it validate this */
        if (node->schema->nodetype & LYS_LEAFLIST) {
            if (((struct lys_node_leaflist *)node->schema)->max) {
                node->parent->validity |= LYD_VAL_MAND;
            }
        } else if (node->schema->nodetype & LYS_LIST) {
            if (((struct lys_node_list *)node->schema)->max) {
                node->parent->validity |= LYD_VAL_MAND;
            }
        }
    }
}